

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzhierarquicalgrid.cpp
# Opt level: O2

TPZGeoMesh * __thiscall
TPZHierarquicalGrid::ComputeExtrusion(TPZHierarquicalGrid *this,REAL t,REAL dt,int n)

{
  double dVar1;
  TPZFunction<double> *pTVar2;
  int iVar3;
  TPZGeoMesh *pTVar4;
  ulong uVar5;
  TPZGeoNode *pTVar6;
  TPZGeoNode *this_00;
  TPZGeoEl **ppTVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong nelem;
  int iel;
  long lVar11;
  long local_118;
  double local_d0;
  TPZVec<double> Coordinates;
  int elid;
  double *local_a0;
  double local_88;
  ulong uStack_80;
  TPZVec<double> NewCoordinates;
  TPZVec<double> NewCoordinates_r;
  
  TPZVec<TPZAutoPointer<TPZGeoMesh>_>::Resize(&this->fSubBases,(long)(n + 1));
  pTVar4 = (TPZGeoMesh *)operator_new(0x2a8);
  TPZGeoMesh::TPZGeoMesh(pTVar4);
  this->fComputedGeomesh = pTVar4;
  uVar10 = (((this->fBase).fRef)->fPointer->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>.
           fNElements;
  iVar3 = (int)uVar10;
  TPZAdmChunkVector<TPZGeoNode,_10>::Resize(&pTVar4->fNodeVec,(n + 1) * iVar3);
  local_118 = 0;
  uVar5 = 0;
  if (0 < iVar3) {
    uVar5 = uVar10 & 0xffffffff;
  }
  local_88 = 1.0;
  uStack_80 = 0;
  iVar8 = 0;
  for (uVar10 = 0; (long)uVar10 <= (long)n; uVar10 = uVar10 + 1) {
    for (nelem = 0; uVar5 != nelem; nelem = nelem + 1) {
      TPZVec<double>::TPZVec((TPZVec<double> *)&elid,1);
      NewCoordinates._vptr_TPZVec = (_func_int **)0x0;
      TPZVec<double>::TPZVec(&NewCoordinates_r,3,(double *)&NewCoordinates);
      Coordinates._vptr_TPZVec = (_func_int **)0x0;
      TPZVec<double>::TPZVec(&NewCoordinates,3,(double *)&Coordinates);
      *local_a0 = (double)(int)uVar10 * dt + t;
      local_d0 = 0.0;
      TPZVec<double>::TPZVec(&Coordinates,3,&local_d0);
      pTVar6 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(((this->fBase).fRef)->fPointer->fNodeVec).
                           super_TPZChunkVector<TPZGeoNode,_10>,nelem);
      lVar11 = local_118 + nelem;
      this_00 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                          (&(this->fComputedGeomesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                           lVar11);
      TPZGeoNode::operator=(this_00,pTVar6);
      pTVar6 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(this->fComputedGeomesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                          lVar11);
      TPZGeoNode::GetCoordinates(pTVar6,&Coordinates);
      pTVar2 = ((this->fParametricFunction).fRef)->fPointer;
      (**(code **)((long)*pTVar2 + 0x60))(pTVar2,&elid,&NewCoordinates);
      dVar1 = *NewCoordinates.fStore;
      *NewCoordinates_r.fStore = dVar1;
      NewCoordinates_r.fStore[1] = NewCoordinates.fStore[1];
      NewCoordinates_r.fStore[2] = NewCoordinates.fStore[2];
      if ((((uVar10 & 1) == 0) || (this->fNonAffineQ != true)) ||
         (((this->fBase).fRef)->fPointer->fDim != 2)) {
        *Coordinates.fStore = dVar1 + *Coordinates.fStore;
        Coordinates.fStore[1] = NewCoordinates_r.fStore[1] + Coordinates.fStore[1];
        Coordinates.fStore[2] = NewCoordinates_r.fStore[2] + Coordinates.fStore[2];
      }
      else {
        *Coordinates.fStore = dVar1 + *Coordinates.fStore;
        Coordinates.fStore[1] = NewCoordinates_r.fStore[1] + Coordinates.fStore[1];
        Coordinates.fStore[2] =
             local_88 * dt * 0.5 + NewCoordinates_r.fStore[2] + Coordinates.fStore[2];
        local_88 = -local_88;
        uStack_80 = uStack_80 ^ 0x8000000000000000;
      }
      pTVar6 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(this->fComputedGeomesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                          lVar11);
      TPZGeoNode::SetCoord(pTVar6,&Coordinates);
      pTVar6 = TPZChunkVector<TPZGeoNode,_10>::operator[]
                         (&(this->fComputedGeomesh->fNodeVec).super_TPZChunkVector<TPZGeoNode,_10>,
                          lVar11);
      pTVar6->fId = iVar8 + (int)nelem;
      TPZVec<double>::~TPZVec(&Coordinates);
      TPZVec<double>::~TPZVec(&NewCoordinates);
      TPZVec<double>::~TPZVec(&NewCoordinates_r);
      TPZVec<double>::~TPZVec((TPZVec<double> *)&elid);
    }
    local_118 = local_118 + iVar3;
    iVar8 = iVar8 + (int)nelem;
  }
  lVar11 = this->fComputedGeomesh->fNodeMaxId;
  lVar9 = (long)iVar8;
  if (iVar8 < lVar11) {
    lVar9 = lVar11;
  }
  this->fComputedGeomesh->fNodeMaxId = lVar9;
  elid = 0;
  for (lVar11 = 0; pTVar4 = ((this->fBase).fRef)->fPointer,
      lVar11 < (pTVar4->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
      lVar11 = lVar11 + 1) {
    ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(pTVar4->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,lVar11);
    iVar3 = (**(code **)(*(long *)*ppTVar7 + 0x210))();
    ppTVar7 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                        (&(((this->fBase).fRef)->fPointer->fElementVec).
                          super_TPZChunkVector<TPZGeoEl_*,_10>,lVar11);
    CreateGeometricElement(this,n,(int)lVar11,iVar3,(*ppTVar7)->fMatId,&elid);
  }
  pTVar4 = this->fComputedGeomesh;
  lVar11 = (long)elid;
  if ((long)elid < pTVar4->fElementMaxId) {
    lVar11 = pTVar4->fElementMaxId;
  }
  pTVar4->fElementMaxId = lVar11;
  TPZGeoMesh::BuildConnectivity(pTVar4);
  return this->fComputedGeomesh;
}

Assistant:

TPZGeoMesh * TPZHierarquicalGrid::ComputeExtrusion(REAL t, REAL dt, int n)
{
    fSubBases.Resize(n+1);
    fComputedGeomesh = new TPZGeoMesh;
    int NNodesBase = fBase->NNodes();
    fComputedGeomesh->NodeVec().Resize( (n+1) * NNodesBase);
    
    // Creating new elements
    int nodeId = 0;
    REAL sing = 1.0;
    for(int il = 0; il < (n+1); il++ )
    {
        // copying l extrusions
        // For a while all of them are equal
        //        fSubBases[il] = new TPZGeoMesh(fBase);
        
        for(int inode = 0; inode < NNodesBase; inode++)
        {
            TPZVec<REAL> tpara(1),NewCoordinates_r(3,0.0);
            TPZVec<REAL> NewCoordinates(3,0.0);
            tpara[0] = dt*il+t;
            
            TPZVec<REAL> Coordinates(3,0.0);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase] =  fBase->NodeVec()[inode];
            //            NewGeomesh->NodeVec()[inode + il*fBase->NNodes()] =  fSubBases[il]->NodeVec()[inode];
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].GetCoordinates(Coordinates);
            
            fParametricFunction->Execute(tpara,NewCoordinates);
            NewCoordinates_r[0] = REAL(NewCoordinates[0]);
            NewCoordinates_r[1] = REAL(NewCoordinates[1]);
            NewCoordinates_r[2] = REAL(NewCoordinates[2]);
            
            if(((il+1)%2==0 && fNonAffineQ) && fBase->Dimension() == 2){
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
                Coordinates[2]+= sing*dt/2.0;
                sing *= -1.0;
            }
            else{
                Coordinates[0]+=NewCoordinates_r[0];
                Coordinates[1]+=NewCoordinates_r[1];
                Coordinates[2]+=NewCoordinates_r[2];
            }
            
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetCoord(Coordinates);
            fComputedGeomesh->NodeVec()[inode + il * NNodesBase].SetNodeId(nodeId);
            nodeId++;
        }
    }
    
    fComputedGeomesh->SetMaxNodeId(nodeId);
    
//    int fbasedim = fBase->Dimension();
    
    int elid=0;
    for(int iel = 0; iel < fBase->NElements(); iel++)
    {
        int ielDim      = fBase->ElementVec()[iel]->Dimension();
        int ielMatId    = fBase->ElementVec()[iel]->MaterialId();
        CreateGeometricElement(n,iel,ielDim,ielMatId,elid);
    }
    
    fComputedGeomesh->SetMaxElementId(elid);
    fComputedGeomesh->BuildConnectivity();
    return fComputedGeomesh;
    
}